

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O1

void __thiscall
slang::ast::AssignmentExpression::visitExprs<no_legacy_generate::MainVisitor&>
          (AssignmentExpression *this,AlwaysFFVisitor *visitor)

{
  if (this->timingControl != (TimingControl *)0x0) {
    TimingControl::visit<no_legacy_generate::MainVisitor>(this->timingControl,visitor);
  }
  Expression::visitExpression<slang::ast::Expression_const,no_legacy_generate::MainVisitor&>
            (this->left_,this->left_,visitor);
  Expression::visitExpression<slang::ast::Expression_const,no_legacy_generate::MainVisitor&>
            (this->right_,this->right_,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        if (timingControl)
            timingControl->visit(visitor);
        left().visit(visitor);
        right().visit(visitor);
    }